

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_interface_variables_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::RemoveUnusedInterfaceVariablesContext::Modify
          (RemoveUnusedInterfaceVariablesContext *this)

{
  Instruction *pIVar1;
  _Type *pacVar2;
  uint uVar3;
  _Type *pacVar4;
  long lVar5;
  long lVar6;
  undefined1 local_88 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_68;
  undefined1 local_60 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_38;
  
  pIVar1 = this->entry_;
  uVar3 = (pIVar1->has_result_id_ & 1) + 1;
  if (pIVar1->has_type_id_ == false) {
    uVar3 = (uint)pIVar1->has_result_id_;
  }
  uVar3 = ~uVar3 + (int)((ulong)((long)(pIVar1->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pIVar1->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
  ;
  if (2 < (int)uVar3) {
    lVar5 = (ulong)uVar3 + 1;
    lVar6 = (ulong)uVar3 * 0x30;
    do {
      pIVar1 = this->entry_;
      uVar3 = (pIVar1->has_result_id_ & 1) + 1;
      if (pIVar1->has_type_id_ == false) {
        uVar3 = (uint)pIVar1->has_result_id_;
      }
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                (&pIVar1->operands_,
                 (Operand *)
                 ((long)((((pIVar1->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                        0xfffffffffffffffa) + lVar6 + (ulong)(uVar3 * 0x30)));
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + -0x30;
    } while (3 < lVar5);
  }
  pacVar2 = (_Type *)(this->operands_to_add_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
  for (pacVar4 = (_Type *)(this->operands_to_add_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start; pacVar4 != pacVar2;
      pacVar4 = pacVar4 + 1) {
    local_88._16_4_ = *pacVar4;
    pIVar1 = this->entry_;
    local_88._0_8_ = &PTR__SmallVector_009488e0;
    local_88._24_8_ = local_88 + 0x10;
    local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_88._8_8_ = 1;
    local_60._0_4_ = SPV_OPERAND_TYPE_ID;
    local_60._8_8_ = &PTR__SmallVector_009488e0;
    local_60._16_8_ = 0;
    local_60._32_8_ = local_60 + 0x18;
    local_38._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(local_60 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_88);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&pIVar1->operands_,(Operand *)local_60);
    local_60._8_8_ = &PTR__SmallVector_009488e0;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_38._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_38,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_38._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_38._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_88._0_8_ = &PTR__SmallVector_009488e0;
    if (local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_68,local_68._M_head_impl);
    }
  }
  return;
}

Assistant:

void Modify() {
    for (int i = entry_.NumInOperands() - 1; i >= 3; --i)
      entry_.RemoveInOperand(i);
    for (auto id : operands_to_add_) {
      entry_.AddOperand(Operand(SPV_OPERAND_TYPE_ID, {id}));
    }
  }